

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O2

bool dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::_removeBidirectionalEdge
               (LLVMNode *ths,LLVMNode *n,EdgesT *ths_cont,EdgesT *n_cont)

{
  size_t sVar1;
  
  sVar1 = DGContainer<dg::LLVMNode_*,_4U>::erase(&n_cont->super_DGContainer<dg::LLVMNode_*,_4U>,ths)
  ;
  DGContainer<dg::LLVMNode_*,_4U>::erase(&ths_cont->super_DGContainer<dg::LLVMNode_*,_4U>,n);
  return sVar1 != 0;
}

Assistant:

static bool _removeBidirectionalEdge(NodeT *ths, NodeT *n, EdgesT &ths_cont,
                                         EdgesT &n_cont) {
        bool ret1 = n_cont.erase(ths);
#ifndef NDEBUG
        bool ret2 =
#endif
                ths_cont.erase(n);

        // must have both or none
        assert(ret1 == ret2 && "An edge without rev. or vice versa");

        return ret1;
    }